

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

FT_Error cid_read_subrs(CID_Face face)

{
  uint uVar1;
  FT_Pointer pvVar2;
  PS_Table_FuncsRec *pPVar3;
  FT_ULong len_1;
  FT_ULong len;
  uchar *puStack_78;
  FT_UInt new_max;
  FT_Byte *p;
  FT_ULong data_len;
  uint local_60;
  FT_UInt num_subrs;
  FT_UInt count;
  FT_Int lenIV;
  CID_FaceDict dict;
  PSAux_Service psaux;
  FT_ULong *offsets;
  uint *puStack_38;
  FT_UInt max_offsets;
  CID_Subrs subr;
  FT_UInt n;
  FT_Error error;
  FT_Stream stream;
  FT_Memory memory;
  CID_FaceInfo cid;
  CID_Face face_local;
  
  memory = (FT_Memory)&face->cid;
  stream = (FT_Stream)(face->root).memory;
  _n = face->cid_stream;
  offsets._4_4_ = 0;
  psaux = (PSAux_Service)0x0;
  dict = (CID_FaceDict)face->psaux;
  cid = (CID_FaceInfo)face;
  pvVar2 = ft_mem_realloc((FT_Memory)stream,0x10,0,(ulong)(face->cid).num_dicts,(void *)0x0,
                          (FT_Error *)((long)&subr + 4));
  cid[1].xuid[0xf] = (FT_ULong)pvVar2;
  if (subr._4_4_ == 0) {
    puStack_38 = (uint *)cid[1].xuid[0xf];
    for (subr._0_4_ = 0; (uint)subr < *(uint *)&memory[9].free; subr._0_4_ = (uint)subr + 1) {
      _count = memory[9].realloc + (ulong)(uint)subr * 0x150;
      num_subrs = *(FT_UInt *)(_count + 4);
      data_len._4_4_ = *(uint *)(_count + 0x138);
      if (data_len._4_4_ != 0) {
        uVar1 = offsets._4_4_;
        if (offsets._4_4_ < data_len._4_4_ + 1) {
          uVar1 = data_len._4_4_ + 4 & 0xfffffffc;
          if (offsets._4_4_ < uVar1) {
            psaux = (PSAux_Service)
                    ft_mem_qrealloc((FT_Memory)stream,8,(ulong)offsets._4_4_,(ulong)uVar1,psaux,
                                    (FT_Error *)((long)&subr + 4));
            if (subr._4_4_ == 0) goto LAB_002fa1f5;
          }
          else {
            subr._4_4_ = 0xa0;
          }
        }
        else {
LAB_002fa1f5:
          offsets._4_4_ = uVar1;
          subr._4_4_ = FT_Stream_Seek(_n,(long)memory[10].user + *(long *)(_count + 0x140));
          if ((subr._4_4_ == 0) &&
             (subr._4_4_ = FT_Stream_EnterFrame
                                     (_n,(ulong)((data_len._4_4_ + 1) * *(int *)(_count + 0x148))),
             subr._4_4_ == 0)) {
            puStack_78 = _n->cursor;
            for (local_60 = 0; local_60 <= data_len._4_4_; local_60 = local_60 + 1) {
              pPVar3 = (PS_Table_FuncsRec *)
                       cid_get_offset(&stack0xffffffffffffff88,*(FT_UInt *)(_count + 0x148));
              (&psaux->ps_table_funcs)[local_60] = pPVar3;
            }
            FT_Stream_ExitFrame(_n);
            for (local_60 = 1; local_60 <= data_len._4_4_; local_60 = local_60 + 1) {
              if ((&psaux->ps_table_funcs)[local_60] < (&psaux->ps_table_funcs)[local_60 - 1]) {
                subr._4_4_ = 3;
                goto LAB_002fa4e1;
              }
            }
            if ((PS_Table_FuncsRec *)(_n->size - (long)memory[10].user) <
                (&psaux->ps_table_funcs)[data_len._4_4_]) {
              subr._4_4_ = 3;
            }
            else {
              p = (FT_Byte *)
                  ((long)(&psaux->ps_table_funcs)[data_len._4_4_] - (long)psaux->ps_table_funcs);
              pvVar2 = ft_mem_qrealloc((FT_Memory)stream,8,0,(ulong)(data_len._4_4_ + 1),(void *)0x0
                                       ,(FT_Error *)((long)&subr + 4));
              *(FT_Pointer *)(puStack_38 + 2) = pvVar2;
              if (subr._4_4_ == 0) {
                pvVar2 = ft_mem_qalloc((FT_Memory)stream,(FT_Long)p,(FT_Error *)((long)&subr + 4));
                **(undefined8 **)(puStack_38 + 2) = pvVar2;
                if (((subr._4_4_ == 0) &&
                    (subr._4_4_ = FT_Stream_Seek(_n,(long)memory[10].user +
                                                    (long)psaux->ps_table_funcs), subr._4_4_ == 0))
                   && (subr._4_4_ = FT_Stream_Read(_n,(FT_Byte *)**(undefined8 **)(puStack_38 + 2),
                                                   (FT_ULong)p), subr._4_4_ == 0)) {
                  for (local_60 = 1; local_60 <= data_len._4_4_; local_60 = local_60 + 1) {
                    *(long *)(*(long *)(puStack_38 + 2) + (ulong)local_60 * 8) =
                         (long)(&psaux->ps_table_funcs)[local_60] +
                         (*(long *)(*(long *)(puStack_38 + 2) + (ulong)(local_60 - 1) * 8) -
                         (long)(&psaux->ps_table_funcs)[local_60 - 1]);
                  }
                  if (-1 < (int)num_subrs) {
                    for (local_60 = 0; local_60 < data_len._4_4_; local_60 = local_60 + 1) {
                      (**(code **)((dict->private_dict).blue_values + 10))
                                (*(undefined8 *)(*(long *)(puStack_38 + 2) + (ulong)local_60 * 8),
                                 (long)(&psaux->ps_table_funcs)[local_60 + 1] -
                                 (long)(&psaux->ps_table_funcs)[local_60],0x10ea);
                    }
                  }
                  *puStack_38 = data_len._4_4_;
                  goto LAB_002fa4a2;
                }
              }
            }
          }
        }
LAB_002fa4e1:
        if (cid[1].xuid[0xf] != 0) {
          for (subr._0_4_ = 0; (uint)subr < *(uint *)&memory[9].free; subr._0_4_ = (uint)subr + 1) {
            if (*(long *)(cid[1].xuid[0xf] + (ulong)(uint)subr * 0x10 + 8) != 0) {
              ft_mem_free((FT_Memory)stream,
                          (void *)**(undefined8 **)(cid[1].xuid[0xf] + (ulong)(uint)subr * 0x10 + 8)
                         );
              **(undefined8 **)(cid[1].xuid[0xf] + (ulong)(uint)subr * 0x10 + 8) = 0;
            }
            ft_mem_free((FT_Memory)stream,
                        *(void **)(cid[1].xuid[0xf] + (ulong)(uint)subr * 0x10 + 8));
            *(undefined8 *)(cid[1].xuid[0xf] + (ulong)(uint)subr * 0x10 + 8) = 0;
          }
          ft_mem_free((FT_Memory)stream,(void *)cid[1].xuid[0xf]);
          cid[1].xuid[0xf] = 0;
        }
        break;
      }
LAB_002fa4a2:
      puStack_38 = puStack_38 + 4;
    }
  }
  ft_mem_free((FT_Memory)stream,psaux);
  return subr._4_4_;
}

Assistant:

static FT_Error
  cid_read_subrs( CID_Face  face )
  {
    CID_FaceInfo   cid    = &face->cid;
    FT_Memory      memory = face->root.memory;
    FT_Stream      stream = face->cid_stream;
    FT_Error       error;
    FT_UInt        n;
    CID_Subrs      subr;
    FT_UInt        max_offsets = 0;
    FT_ULong*      offsets = NULL;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    if ( FT_NEW_ARRAY( face->subrs, cid->num_dicts ) )
      goto Exit;

    subr = face->subrs;
    for ( n = 0; n < cid->num_dicts; n++, subr++ )
    {
      CID_FaceDict  dict  = cid->font_dicts + n;
      FT_Int        lenIV = dict->private_dict.lenIV;
      FT_UInt       count, num_subrs = dict->num_subrs;
      FT_ULong      data_len;
      FT_Byte*      p;


      if ( !num_subrs )
        continue;

      /* reallocate offsets array if needed */
      if ( num_subrs + 1 > max_offsets )
      {
        FT_UInt  new_max = FT_PAD_CEIL( num_subrs + 1, 4 );


        if ( new_max <= max_offsets )
        {
          error = FT_THROW( Syntax_Error );
          goto Fail;
        }

        if ( FT_QRENEW_ARRAY( offsets, max_offsets, new_max ) )
          goto Fail;

        max_offsets = new_max;
      }

      /* read the subrmap's offsets */
      if ( FT_STREAM_SEEK( cid->data_offset + dict->subrmap_offset ) ||
           FT_FRAME_ENTER( ( num_subrs + 1 ) * dict->sd_bytes )      )
        goto Fail;

      p = (FT_Byte*)stream->cursor;
      for ( count = 0; count <= num_subrs; count++ )
        offsets[count] = cid_get_offset( &p, dict->sd_bytes );

      FT_FRAME_EXIT();

      /* offsets must be ordered */
      for ( count = 1; count <= num_subrs; count++ )
        if ( offsets[count - 1] > offsets[count] )
        {
          FT_ERROR(( "cid_read_subrs: offsets are not ordered\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

      if ( offsets[num_subrs] > stream->size - cid->data_offset )
      {
        FT_ERROR(( "cid_read_subrs: too large `subrs' offsets\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* now, compute the size of subrs charstrings, */
      /* allocate, and read them                     */
      data_len = offsets[num_subrs] - offsets[0];

      if ( FT_QNEW_ARRAY( subr->code, num_subrs + 1 ) ||
           FT_QALLOC( subr->code[0], data_len )       )
        goto Fail;

      if ( FT_STREAM_SEEK( cid->data_offset + offsets[0] ) ||
           FT_STREAM_READ( subr->code[0], data_len )       )
        goto Fail;

      /* set up pointers */
      for ( count = 1; count <= num_subrs; count++ )
      {
        FT_ULong  len;


        len               = offsets[count] - offsets[count - 1];
        subr->code[count] = subr->code[count - 1] + len;
      }

      /* decrypt subroutines, but only if lenIV >= 0 */
      if ( lenIV >= 0 )
      {
        for ( count = 0; count < num_subrs; count++ )
        {
          FT_ULong  len;


          len = offsets[count + 1] - offsets[count];
          psaux->t1_decrypt( subr->code[count], len, 4330 );
        }
      }

      subr->num_subrs = (FT_Int)num_subrs;
    }

  Exit:
    FT_FREE( offsets );
    return error;

  Fail:
    if ( face->subrs )
    {
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        if ( face->subrs[n].code )
          FT_FREE( face->subrs[n].code[0] );

        FT_FREE( face->subrs[n].code );
      }
      FT_FREE( face->subrs );
    }
    goto Exit;
  }